

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p_p.h
# Opt level: O0

void __thiscall QObjectPrivate::ConnectionData::resizeSignalVector(ConnectionData *this,size_t size)

{
  bool bVar1;
  TaggedSignalVector __i;
  SignalVector *this_00;
  ulong in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  int i;
  int start;
  SignalVector *newVector;
  void *ptr;
  SignalVector *vector;
  TaggedSignalVector o;
  Type in_stack_ffffffffffffff98;
  ConnectionList *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int i_00;
  int iVar2;
  size_t in_stack_ffffffffffffffb8;
  SignalVector *pSVar3;
  memory_order __m;
  TaggedSignalVector local_28;
  anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 local_20;
  anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  __i.c = (quintptr)
          QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                    ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x4055f3);
  if (((Type)__i.c == (Type)0x0) || (((Type)__i.c)->allocated <= local_10)) {
    local_10 = local_10 + 7 & 0xfffffffffffffff8;
    this_00 = (SignalVector *)
              QtPrivate::fittedMalloc
                        (in_stack_ffffffffffffffb8,
                         (size_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_RDI,(size_t)in_stack_ffffffffffffffa0);
    i_00 = -1;
    iVar2 = i_00;
    pSVar3 = this_00;
    if ((Type)__i.c != (Type)0x0) {
      memcpy(this_00,(void *)__i.c,(((Type)__i.c)->allocated + 1) * 0x10 + 0x10);
      i_00 = SignalVector::count((SignalVector *)__i.c);
      iVar2 = i_00;
    }
    for (; __m = (memory_order)((ulong)pSVar3 >> 0x20), i_00 < (int)local_10; i_00 = i_00 + 1) {
      in_stack_ffffffffffffffa0 = SignalVector::at(this_00,i_00);
      memset(in_stack_ffffffffffffffa0,0,0x10);
      ConnectionList::ConnectionList(in_stack_ffffffffffffffa0);
    }
    (this_00->super_ConnectionOrSignalVector).field_0.next = (Connection *)0x0;
    this_00->allocated = local_10;
    QBasicAtomicPointer<QObjectPrivate::SignalVector>::storeRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    if ((Type)__i.c != (Type)0x0) {
      local_18.next = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
      TaggedSignalVector::TaggedSignalVector(&local_18.nextInOrphanList,(nullptr_t)0x0);
      local_20.nextInOrphanList =
           std::atomic<QObjectPrivate::TaggedSignalVector>::load
                     ((atomic<QObjectPrivate::TaggedSignalVector> *)__i.c,__m);
      local_18.nextInOrphanList.c = local_20.nextInOrphanList.c;
      do {
        (((SignalVector *)__i.c)->super_ConnectionOrSignalVector).field_0.nextInOrphanList.c =
             (quintptr)local_18;
        TaggedSignalVector::TaggedSignalVector(&local_28,(SignalVector *)__i.c);
        bVar1 = std::atomic<QObjectPrivate::TaggedSignalVector>::compare_exchange_strong
                          ((atomic<QObjectPrivate::TaggedSignalVector> *)this_00,
                           (TaggedSignalVector *)CONCAT44(iVar2,i_00),__i,
                           (memory_order)(in_RDI >> 0x20));
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void resizeSignalVector(size_t size)
    {
        SignalVector *vector = this->signalVector.loadRelaxed();
        if (vector && vector->allocated > size)
            return;
        size = (size + 7) & ~7;
        void *ptr = QtPrivate::fittedMalloc(sizeof(SignalVector), &size, sizeof(ConnectionList), 1);
        auto newVector = new (ptr) SignalVector;

        int start = -1;
        if (vector) {
            // not (yet) existing trait:
            // static_assert(std::is_relocatable_v<SignalVector>);
            // static_assert(std::is_relocatable_v<ConnectionList>);
            memcpy(newVector, vector,
                   sizeof(SignalVector) + (vector->allocated + 1) * sizeof(ConnectionList));
            start = vector->count();
        }
        for (int i = start; i < int(size); ++i)
            new (&newVector->at(i)) ConnectionList();
        newVector->next = nullptr;
        newVector->allocated = size;

        signalVector.storeRelaxed(newVector);
        if (vector) {
            TaggedSignalVector o = nullptr;
            /* No ABA issue here: When adding a node, we only care about the list head, it doesn't
             * matter if the tail changes.
             */
            o = orphaned.load(std::memory_order_acquire);
            do {
                vector->nextInOrphanList = o;
            } while (!orphaned.compare_exchange_strong(o, TaggedSignalVector(vector), std::memory_order_release));
        }
    }